

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void initValue(Storage3D *ref,ElementType val,int64_t domain_size,int64_t domain_heigh)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  
  iVar3 = halo_width;
  lVar4 = -halo_width;
  lVar6 = domain_size + halo_width;
  if (-lVar6 != halo_width && lVar6 <= lVar4) {
    lVar6 = lVar4;
  }
  lVar1 = halo_width * 8;
  lVar7 = halo_width * -8;
  lVar8 = lVar7;
  for (lVar9 = lVar4; lVar9 != lVar6; lVar9 = lVar9 + 1) {
    lVar10 = domain_height + iVar3;
    if (-lVar10 != iVar3 && lVar10 <= lVar4) {
      lVar10 = lVar4;
    }
    lVar5 = lVar7;
    for (lVar13 = lVar4; lVar13 != lVar6; lVar13 = lVar13 + 1) {
      lVar2 = (ref->strides)._M_elems[0];
      puVar11 = (undefined8 *)
                (((ref->offset * 8 +
                  (ref->strides)._M_elems[1] * lVar5 + (ref->strides)._M_elems[2] * lVar8) -
                 lVar1 * lVar2) + (long)ref->alignedPtr);
      lVar12 = lVar10 + iVar3;
      while (bVar14 = lVar12 != 0, lVar12 = lVar12 + -1, bVar14) {
        *puVar11 = 0;
        puVar11 = puVar11 + lVar2;
      }
      lVar5 = lVar5 + 8;
    }
    lVar8 = lVar8 + 8;
  }
  return;
}

Assistant:

void initValue(Storage3D &ref, const ElementType val, const int64_t domain_size, const int64_t domain_heigh) {
  for (int64_t i = -halo_width; i < domain_size + halo_width; ++i)
    for (int64_t j = -halo_width; j < domain_size + halo_width; ++j)
      for (int64_t k = -halo_width; k < domain_height + halo_width; ++k) {
        ref(i, j, k) = val;
      }
}